

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::insert
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t index,utf32_t x,
          size_t count)

{
  C *p;
  size_t sVar1;
  C pattern [1];
  
  sVar1 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length;
  if (count != 0) {
    p = insertSpace(this,index,count);
    if (p == (C *)0x0) {
      sVar1 = 0xffffffffffffffff;
    }
    else {
      fillWithPattern(p,pattern,1,count);
      sVar1 = sVar1 + count;
    }
  }
  return sVar1;
}

Assistant:

size_t
	insert(
		size_t index,
		utf32_t x,
		size_t count
	) {
		size_t oldLength = this->m_length;

		if (count == 0)
			return oldLength;

		C pattern[sizeof(utf32_t) / sizeof(C)];
		C* end = Encoding::Encoder::encode(pattern, x);
		size_t codePointLength = end - pattern;
		ASSERT(codePointLength <= countof(pattern));

		size_t insertLength = count * codePointLength;
		C* dst = insertSpace(index, count * codePointLength);
		if (!dst)
			return -1;

		fillWithPattern(dst, pattern, codePointLength, count);
		return oldLength + insertLength;
	}